

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGNormExtSpace(xmlChar *value)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  xmlChar *start;
  
  if (value == (xmlChar *)0x0) {
    return;
  }
  lVar2 = 0;
  while (((ulong)value[lVar2] < 0x21 && ((0x100002600U >> ((ulong)value[lVar2] & 0x3f) & 1) != 0)))
  {
    lVar2 = lVar2 + 1;
  }
  pbVar3 = value;
  if (lVar2 != 0) {
    pbVar3 = value + lVar2;
    do {
      bVar4 = *pbVar3;
      uVar5 = (ulong)bVar4;
      if (uVar5 < 0x21) {
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
joined_r0x001742b2:
          if (uVar5 == 0) {
LAB_001742fe:
            *value = 0;
            return;
          }
        }
        else {
          while (bVar4 = (byte)uVar5, bVar4 < 0x21) {
            if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) goto joined_r0x001742b2;
            pbVar1 = pbVar3 + 1;
            pbVar3 = pbVar3 + 1;
            uVar5 = (ulong)*pbVar1;
          }
        }
      }
      pbVar3 = pbVar3 + 1;
      *value = bVar4;
      value = value + 1;
    } while( true );
  }
LAB_001742ce:
  do {
    value = pbVar3;
    uVar5 = (ulong)*value;
    if (0x20 < uVar5) {
LAB_001742c8:
      pbVar3 = value + 1;
      goto LAB_001742ce;
    }
    pbVar3 = value;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0) {
        return;
      }
      goto LAB_001742c8;
    }
    while ((byte)uVar5 < 0x21) {
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 == 0) goto LAB_001742fe;
        break;
      }
      pbVar1 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
      uVar5 = (ulong)*pbVar1;
    }
  } while( true );
}

Assistant:

static void
xmlRelaxNGNormExtSpace(xmlChar * value)
{
    xmlChar *start = value;
    xmlChar *cur = value;

    if (value == NULL)
        return;

    while (IS_BLANK_CH(*cur))
        cur++;
    if (cur == start) {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                cur++;
            if (*cur == 0)
                return;
            start = cur;
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
        } while (1);
    } else {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                *start++ = *cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            /* don't try to normalize the inner spaces */
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            *start++ = *cur++;
        } while (1);
    }
}